

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::Parser::SetRootType(Parser *this,char *name)

{
  StructDef *pSVar1;
  allocator local_39;
  string local_38;
  char *local_18;
  char *name_local;
  Parser *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  pSVar1 = SymbolTable<flatbuffers::StructDef>::Lookup(&this->structs_,&local_38);
  this->root_struct_def = pSVar1;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return this->root_struct_def != (StructDef *)0x0;
}

Assistant:

bool Parser::SetRootType(const char *name) {
  root_struct_def = structs_.Lookup(name);
  return root_struct_def != nullptr;
}